

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizationCreator.hpp
# Opt level: O0

void __thiscall
OpenMD::OptimizationBuilder<QuantLib::ConjugateGradient>::~OptimizationBuilder
          (OptimizationBuilder<QuantLib::ConjugateGradient> *this)

{
  void *in_RDI;
  
  ~OptimizationBuilder((OptimizationBuilder<QuantLib::ConjugateGradient> *)0x236e18);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

OptimizationBuilder(const std::string& ident) :
        OptimizationCreator(ident) {}